

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::Resize
          (InnerMap *this,size_t new_num_buckets)

{
  bool bVar1;
  void **ppvVar2;
  void *in_RSI;
  void **in_RDI;
  size_type i;
  size_type start;
  size_type old_table_size;
  void **old_table;
  size_type in_stack_ffffffffffffff68;
  void **in_stack_ffffffffffffff70;
  InnerMap *this_00;
  InnerMap *index;
  void **table;
  InnerMap *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  InnerMap *in_stack_ffffffffffffffc0;
  
  table = (void **)in_RDI[4];
  index = (InnerMap *)in_RDI[1];
  in_RDI[1] = in_RSI;
  ppvVar2 = CreateEmptyTable((InnerMap *)old_table,old_table_size);
  in_RDI[4] = ppvVar2;
  this_00 = (InnerMap *)in_RDI[3];
  in_RDI[3] = in_RDI[1];
  for (; this_00 < index; this_00 = (InnerMap *)((long)&this_00->num_elements_ + 1)) {
    bVar1 = TableEntryIsNonEmptyList(table,(size_type)this_00);
    if (bVar1) {
      TransferList(in_stack_ffffffffffffffa0,table,(size_type)index);
    }
    else {
      bVar1 = TableEntryIsTree(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (bVar1) {
        this_00 = (InnerMap *)((long)&this_00->num_elements_ + 1);
        TransferTree(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      }
    }
  }
  Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::Dealloc<void*>
            (this_00,in_RDI,(size_type)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void Resize(size_t new_num_buckets) {
      GOOGLE_DCHECK_GE(new_num_buckets, kMinTableSize);
      void** const old_table = table_;
      const size_type old_table_size = num_buckets_;
      num_buckets_ = new_num_buckets;
      table_ = CreateEmptyTable(num_buckets_);
      const size_type start = index_of_first_non_null_;
      index_of_first_non_null_ = num_buckets_;
      for (size_type i = start; i < old_table_size; i++) {
        if (TableEntryIsNonEmptyList(old_table, i)) {
          TransferList(old_table, i);
        } else if (TableEntryIsTree(old_table, i)) {
          TransferTree(old_table, i++);
        }
      }
      Dealloc<void*>(old_table, old_table_size);
    }